

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9_count_char_in_string.cpp
# Opt level: O1

int count_char(char *str,char ch)

{
  char *pcVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  undefined8 uStack_38;
  
  if (*str == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    uStack_38 = in_RAX;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"===>",4);
      uStack_38 = CONCAT17(*str,(undefined7)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      iVar3 = iVar3 + (uint)(*str == ch);
      pcVar1 = str + 1;
      str = str + 1;
    } while (*pcVar1 != '\0');
  }
  return iVar3;
}

Assistant:

int count_char(const char * str, char ch)
{
    int count = 0;
    //  *str 是地址处的字符
    while(*str) {
        std::cout << "===>" << *str << std::endl;
        if (*str == ch) {
            count++;
        }
        //  地址+1，指向下一个字符
        str++;
    }
    return count;
}